

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O0

void __thiscall
CaDiCaL::Proof::add_derived_unit_clause
          (Proof *this,uint64_t id,int internal_unit,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *chain)

{
  bool bVar1;
  const_iterator this_00;
  const_iterator __x;
  Proof *in_RCX;
  pointer in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  unsigned_long *cid;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  Proof *in_stack_ffffffffffffffc0;
  
  add_literal(in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20));
  this_00 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_RDI);
  __x = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffffc0 =
         (Proof *)__gnu_cxx::
                  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator*((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)&stack0xffffffffffffffd0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00._M_current,
               __x._M_current);
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)&stack0xffffffffffffffd0);
  }
  in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = in_RSI;
  *(undefined1 *)
   &in_RDI[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0;
  add_derived_clause(in_RCX);
  return;
}

Assistant:

void Proof::add_derived_unit_clause (uint64_t id, int internal_unit,
                                     const vector<uint64_t> &chain) {
  LOG ("PROOF adding unit clause %d", internal_unit);
  assert (proof_chain.empty ());
  assert (clause.empty ());
  add_literal (internal_unit);
  for (const auto &cid : chain)
    proof_chain.push_back (cid);
  clause_id = id;
  redundant = false;
  add_derived_clause ();
}